

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::_::TestMoreStuffImpl>::disposeImpl
          (HeapDisposer<capnp::_::TestMoreStuffImpl> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::_::TestMoreStuffImpl> *this_local;
  
  if (pointer != (void *)0x0) {
    capnp::_::TestMoreStuffImpl::~TestMoreStuffImpl((TestMoreStuffImpl *)pointer);
    operator_delete(pointer,0x40);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }